

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O3

void Abc_NtkQbf(Abc_Ntk_t *pNtk,int nPars,int nItersMax,int fDumpCnf,int fVerbose)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p;
  void *__s;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *vExists;
  char *pcVar7;
  time_t tVar8;
  Abc_Ntk_t *pAVar9;
  Abc_Ntk_t *pAVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  Vec_Int_t *p_00;
  Abc_Ntk_t *local_88;
  ulong local_78;
  timespec ts;
  long local_48;
  long local_40;
  
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQbf.c"
                  ,0x47,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkIsComb(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQbf.c"
                  ,0x48,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQbf.c"
                  ,0x49,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (0 < nPars) {
    uVar4 = pNtk->vPis->nSize;
    if (nPars < (int)uVar4) {
      if (fDumpCnf == 0) {
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        uVar11 = 0x10;
        if (0xe < uVar4 - 1) {
          uVar11 = (ulong)uVar4;
        }
        pVVar5->nCap = (int)uVar11;
        piVar6 = (int *)malloc(uVar11 << 2);
        pVVar5->pArray = piVar6;
        pVVar5->nSize = uVar4;
        memset(piVar6,0,(ulong)uVar4 * 4);
        tVar8 = time((time_t *)0x0);
        srand((uint)tVar8);
        if (nPars < pNtk->vPis->nSize) {
          uVar11 = (ulong)(uint)nPars;
          do {
            uVar4 = rand();
            if (pVVar5->nSize <= (int)uVar11) goto LAB_0028573b;
            pVVar5->pArray[uVar11] = uVar4 & 1;
            uVar11 = uVar11 + 1;
          } while ((int)uVar11 < pNtk->vPis->nSize);
        }
        Abc_NtkVectorClearPars(pVVar5,nPars);
        local_88 = Abc_NtkMiterCofactor(pNtk,pVVar5);
        if (fVerbose != 0) {
          printf("Iter %2d : ",0);
          printf("AIG = %6d  ",(ulong)(uint)local_88->nObjCounts[7]);
          Abc_NtkVectorPrintVars(pNtk,pVVar5,nPars);
          putchar(10);
        }
        uVar4 = 0;
        if (0 < nItersMax) {
          uVar4 = nItersMax;
        }
        uVar11 = 0;
        do {
          local_78 = uVar11;
          if ((uint)local_78 == uVar4) {
            local_78 = (ulong)uVar4;
            break;
          }
          iVar3 = clock_gettime(3,(timespec *)&ts);
          if (iVar3 < 0) {
            local_40 = 1;
          }
          else {
            lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            local_40 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          iVar3 = Abc_NtkDSat(local_88,0,0,0,0,0,1,0,0,0);
          iVar14 = clock_gettime(3,(timespec *)&ts);
          if (iVar14 < 0) {
            local_48 = -1;
          }
          else {
            local_48 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          if (iVar3 != 0) {
            if (iVar3 == -1) {
              pcVar7 = "Synthesis timed out.";
LAB_002855f9:
              puts(pcVar7);
            }
            else if (iVar3 != 1) goto LAB_00285402;
            break;
          }
          Abc_NtkModelToVector(local_88,pVVar5);
LAB_00285402:
          pVVar2 = pNtk->vPis;
          uVar11 = (ulong)(uint)nPars;
          if (nPars < pVVar2->nSize) {
            do {
              if (pVVar5->nSize <= (int)uVar11) goto LAB_0028573b;
              pVVar5->pArray[uVar11] = -1;
              uVar11 = uVar11 + 1;
            } while ((int)uVar11 < pVVar2->nSize);
          }
          pAVar9 = Abc_NtkMiterCofactor(pNtk,pVVar5);
          if (pAVar9->vPos->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          puVar1 = (uint *)((long)*pAVar9->vPos->pArray + 0x14);
          *puVar1 = *puVar1 ^ 0x400;
          clock_gettime(3,(timespec *)&ts);
          iVar3 = Abc_NtkMiterSat(pAVar9,0,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
          clock_gettime(3,(timespec *)&ts);
          if (iVar3 != 0) {
            Abc_NtkDelete(pAVar9);
            if (iVar3 == -1) {
              pcVar7 = "Verification timed out.";
              goto LAB_002855f9;
            }
            if (iVar3 != 1) goto LAB_002854c1;
            Abc_NtkDelete(local_88);
            if ((long)pVVar5->nSize < 1) {
              uVar4 = 0;
            }
            else {
              lVar13 = 0;
              uVar4 = 0;
              do {
                uVar4 = uVar4 + (pVVar5->pArray[lVar13] == 0);
                lVar13 = lVar13 + 1;
              } while (pVVar5->nSize != lVar13);
            }
            printf("Parameters: ");
            uVar11 = 0;
            do {
              if ((long)pVVar5->nSize <= (long)uVar11) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              printf("%d",(ulong)(uint)pVVar5->pArray[uVar11]);
              uVar11 = uVar11 + 1;
            } while ((uint)nPars != uVar11);
            printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar4,(ulong)(pVVar5->nSize - uVar4));
            pcVar7 = "Solved after %d interations.  ";
            goto LAB_00285692;
          }
          Abc_NtkModelToVector(pAVar9,pVVar5);
          Abc_NtkDelete(pAVar9);
LAB_002854c1:
          Abc_NtkVectorClearPars(pVVar5,nPars);
          pAVar9 = Abc_NtkMiterCofactor(pNtk,pVVar5);
          pAVar10 = Abc_NtkMiterAnd(local_88,pAVar9,0,0);
          Abc_NtkDelete(pAVar9);
          Abc_NtkDelete(local_88);
          uVar15 = (uint)local_78 + 1;
          if (fVerbose != 0) {
            printf("Iter %2d : ",(ulong)uVar15);
            printf("AIG = %6d  ",(ulong)(uint)pAVar10->nObjCounts[7]);
            Abc_NtkVectorPrintVars(pNtk,pVVar5,nPars);
            iVar3 = 0x83de02;
            printf("  ");
            Abc_Print(iVar3,"%s =","Syn");
            Abc_Print(iVar3,"%9.2f sec\n",(double)(local_48 + local_40) / 1000000.0);
          }
          uVar11 = (ulong)uVar15;
          local_88 = pAVar10;
        } while (uVar15 != nItersMax);
        Abc_NtkDelete(local_88);
        if ((int)local_78 == nItersMax) {
          pcVar7 = "Unsolved after %d interations.  ";
          local_78 = (ulong)(uint)nItersMax;
LAB_00285692:
          printf(pcVar7,local_78);
          iVar3 = (int)pcVar7;
        }
        else {
          iVar3 = 0x82be6c;
          printf("Implementation does not exist.  ");
        }
        Abc_Print(iVar3,"%s =","Total runtime");
        iVar14 = 3;
        iVar3 = clock_gettime(3,(timespec *)&ts);
        if (iVar3 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
        if (pVVar5->pArray != (int *)0x0) {
          free(pVVar5->pArray);
        }
        free(pVVar5);
      }
      else {
        __s = (void *)0x0;
        pAig = Abc_NtkToDar(pNtk,0,0);
        p = Cnf_Derive(pAig,0);
        iVar3 = p->nVars;
        iVar14 = 0x10;
        if (0xe < iVar3 - 1U) {
          iVar14 = iVar3;
        }
        if (iVar14 != 0) {
          __s = malloc((long)iVar14 << 2);
        }
        memset(__s,0,(long)iVar3 * 4);
        pVVar2 = pAig->vCis;
        uVar11 = (ulong)pVVar2->nSize;
        if (0 < (long)uVar11) {
          uVar16 = 0;
          do {
            if (uVar16 < (uint)nPars) {
              iVar14 = p->pVarNums[*(int *)((long)pVVar2->pArray[uVar16] + 0x24)];
              if (((long)iVar14 < 0) || (iVar3 <= iVar14)) {
LAB_0028573b:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(undefined4 *)((long)__s + (long)iVar14 * 4) = 1;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < uVar11);
        }
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        uVar11 = 0x10;
        if (0x10 < (uint)nPars) {
          uVar11 = (ulong)(uint)nPars;
        }
        pVVar5->nSize = 0;
        pVVar5->nCap = (int)uVar11;
        piVar6 = (int *)malloc(uVar11 << 2);
        pVVar5->pArray = piVar6;
        iVar14 = pNtk->vPis->nSize - nPars;
        vExists = (Vec_Int_t *)malloc(0x10);
        if (iVar14 - 1U < 0xf) {
          iVar14 = 0x10;
        }
        piVar6 = (int *)0x0;
        vExists->nSize = 0;
        vExists->nCap = iVar14;
        if (iVar14 != 0) {
          piVar6 = (int *)malloc((long)iVar14 << 2);
        }
        vExists->pArray = piVar6;
        if (0 < iVar3) {
          lVar12 = 0;
          do {
            p_00 = vExists;
            if (*(int *)((long)__s + lVar12 * 4) != 0) {
              p_00 = pVVar5;
            }
            Vec_IntPush(p_00,(int)lVar12);
            lVar12 = lVar12 + 1;
          } while (iVar3 != lVar12);
        }
        pcVar7 = Extra_FileNameGenericAppend(pNtk->pSpec,".qdimacs");
        Cnf_DataWriteIntoFile(p,pcVar7,0,pVVar5,vExists);
        Aig_ManStop(pAig);
        Cnf_DataFree(p);
        if (pVVar5->pArray != (int *)0x0) {
          free(pVVar5->pArray);
        }
        free(pVVar5);
        if (vExists->pArray != (int *)0x0) {
          free(vExists->pArray);
        }
        free(vExists);
        if (__s != (void *)0x0) {
          free(__s);
        }
        printf("The 2QBF formula was written into file \"%s\".\n",pcVar7);
      }
      return;
    }
  }
  __assert_fail("nPars > 0 && nPars < Abc_NtkPiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQbf.c"
                ,0x4a,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
}

Assistant:

void Abc_NtkQbf( Abc_Ntk_t * pNtk, int nPars, int nItersMax, int fDumpCnf, int fVerbose )
{
    Abc_Ntk_t * pNtkVer, * pNtkSyn, * pNtkSyn2, * pNtkTemp;
    Vec_Int_t * vPiValues;
    abctime clkTotal = Abc_Clock(), clkS, clkV;
    int nIters, nInputs, RetValue, fFound = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsComb(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( nPars > 0 && nPars < Abc_NtkPiNum(pNtk) );
//    assert( Abc_NtkPiNum(pNtk)-nPars < 32 );
    nInputs = Abc_NtkPiNum(pNtk) - nPars;

    if ( fDumpCnf )
    {
        // original problem: \exists p \forall x \exists y.  M(p,x,y)
        // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pMan = Abc_NtkToDar( pNtk, 0, 0 );
        Cnf_Dat_t * pCnf = Cnf_Derive( pMan, 0 );
        Vec_Int_t * vVarMap, * vForAlls, * vExists;
        Aig_Obj_t * pObj;
        char * pFileName;
        int i, Entry;
        // create var map
        vVarMap = Vec_IntStart( pCnf->nVars );
        Aig_ManForEachCi( pMan, pObj, i )
            if ( i < nPars )
                Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        // create various maps
        vForAlls = Vec_IntAlloc( nPars );
        vExists = Vec_IntAlloc( Abc_NtkPiNum(pNtk) - nPars );
        Vec_IntForEachEntry( vVarMap, Entry, i )
            if ( Entry )
                Vec_IntPush( vForAlls, i );
            else
                Vec_IntPush( vExists, i );
        // generate CNF
        pFileName = Extra_FileNameGenericAppend( pNtk->pSpec, ".qdimacs" );
        Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
        Aig_ManStop( pMan );
        Cnf_DataFree( pCnf );
        Vec_IntFree( vForAlls );
        Vec_IntFree( vExists );
        Vec_IntFree( vVarMap );
        printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
        return;
    }

    // initialize the synthesized network with 0000-combination
    vPiValues = Vec_IntStart( Abc_NtkPiNum(pNtk) );

    // create random init value
    {
    int i;
    srand( time(NULL) );
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, rand() & 1 );
    }

    Abc_NtkVectorClearPars( vPiValues, nPars );
    pNtkSyn = Abc_NtkMiterCofactor( pNtk, vPiValues );
    if ( fVerbose )
    {
        printf( "Iter %2d : ", 0 );
        printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
        Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
        printf( "\n" );
    }

    // iteratively solve
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        // solve the synthesis instance
clkS = Abc_Clock();
//        RetValue = Abc_NtkMiterSat( pNtkSyn, 0, 0, 0, NULL, NULL );
        RetValue = Abc_NtkDSat( pNtkSyn, (ABC_INT64_T)0, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
clkS = Abc_Clock() - clkS;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkSyn, vPiValues );
        if ( RetValue == 1 )
        {
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Synthesis timed out.\n" );
            break;
        }
        // there is a counter-example

        // construct the verification instance
        Abc_NtkVectorClearVars( pNtk, vPiValues, nPars );
        pNtkVer = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // complement the output
        Abc_ObjXorFaninC( Abc_NtkPo(pNtkVer,0), 0 );

        // solve the verification instance
clkV = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtkVer, 0, 0, 0, NULL, NULL );
clkV = Abc_Clock() - clkV;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkVer, vPiValues );
        Abc_NtkDelete( pNtkVer );
        if ( RetValue == 1 )
        {
            fFound = 1;
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Verification timed out.\n" );
            break;
        }
        // there is a counter-example

        // create a new synthesis network
        Abc_NtkVectorClearPars( vPiValues, nPars );
        pNtkSyn2 = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // add to the synthesis instance
        pNtkSyn = Abc_NtkMiterAnd( pNtkTemp = pNtkSyn, pNtkSyn2, 0, 0 );
        Abc_NtkDelete( pNtkSyn2 );
        Abc_NtkDelete( pNtkTemp );

        if ( fVerbose )
        {
            printf( "Iter %2d : ", nIters+1 );
            printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
            Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
            printf( "  " );
            ABC_PRT( "Syn", clkS );
//            ABC_PRT( "Ver", clkV );
        }
        if ( nIters+1 == nItersMax )
            break;
    }
    Abc_NtkDelete( pNtkSyn );
    // report the results
    if ( fFound )
    {
        int nZeros = Vec_IntCountZero( vPiValues );
        printf( "Parameters: " );
        Abc_NtkVectorPrintPars( vPiValues, nPars );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(vPiValues) - nZeros );
        printf( "Solved after %d interations.  ", nIters );
    }
    else if ( nIters == nItersMax )
        printf( "Unsolved after %d interations.  ", nIters );
    else if ( nIters == nItersMax )
        printf( "Quit after %d interatios.  ", nItersMax );
    else
        printf( "Implementation does not exist.  " );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    Vec_IntFree( vPiValues );
}